

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::Base64Escape_abi_cxx11_
          (string *__return_storage_ptr__,lts_20250127 *this,string_view src)

{
  uchar *src_00;
  size_type szsrc;
  undefined1 local_20 [8];
  string_view src_local;
  string *dest;
  
  src_local._M_len = src._M_len;
  local_20 = (undefined1  [8])this;
  src_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  src_00 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::data
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  szsrc = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  strings_internal::Base64EscapeInternal<std::__cxx11::string>
            (src_00,szsrc,__return_storage_ptr__,true,
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/");
  return __return_storage_ptr__;
}

Assistant:

std::string Base64Escape(absl::string_view src) {
  std::string dest;
  strings_internal::Base64EscapeInternal(
      reinterpret_cast<const unsigned char*>(src.data()), src.size(), &dest,
      true, strings_internal::kBase64Chars);
  return dest;
}